

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void RK_Individual::criaCromossomos(Graph *g)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Chromosome *in_RAX;
  int iVar3;
  Edge **ppEVar4;
  Chromosome *c;
  
  iVar3 = 0;
  c = in_RAX;
  while (pVVar1 = g->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar4 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      if ((pEVar2->modifiable == true) && (pEVar2->marked == true)) {
        c = (Chromosome *)operator_new(0x18);
        *(undefined8 *)&c->position = 0;
        c->edge = pEVar2;
        c->weight = 0.0;
        c->position = iVar3;
        std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::push_back(&cromossomos,&c);
        iVar3 = iVar3 + 1;
      }
      ppEVar4 = &pEVar2->nextEdge;
    }
    g = (Graph *)&pVVar1->nextVertex;
  }
  return;
}

Assistant:

void RK_Individual::criaCromossomos(Graph *g){
    Chromosome *c;
    int i = 0;
    for(Vertex *v = g->get_verticesList(); v != NULL; v= v->getNext()){

        for(Edge *e = v->getEdgesList(); e != NULL; e= e->getNext()){

            /**individuo possui somente arcos modificaveis e em um sentido
            (antes tinhamos arcos a-b e b-a, agora usamos somente um deles)**/
            if(e->getModifiable() == true && e->getMarked() == true){
                c = new Chromosome();
                c->edge = e;
                c->weight = 0;
                c->position = i;
                cromossomos.push_back(c);
                i++;
            }
        }

    }
}